

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastio.h
# Opt level: O2

void __thiscall OutputStream::writeSQFloat(OutputStream *this,SQFloat f)

{
  anon_union_8_2_9473010d conv;
  SQFloat f_local;
  undefined4 uStack_4;
  
  writeVaruint(this,CONCAT44(uStack_4,f));
  return;
}

Assistant:

void writeSQFloat(SQFloat f) {
#ifdef SQUSEDOUBLE
    writeInt32(*((int32_t*)&f));
#else
    writeInt64(*((int64_t*)&f));
#endif // SQUSEDOUBLE
  }